

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O2

uint8_t * DecodeIntoRGBABuffer
                    (WEBP_CSP_MODE colorspace,uint8_t *data,size_t data_size,uint8_t *rgba,
                    int stride,size_t size)

{
  VP8StatusCode VVar1;
  uint8_t *puVar2;
  WebPDecParams params;
  WebPDecBuffer buf;
  WebPDecParams local_118;
  WebPDecBuffer local_a8;
  
  if (rgba != (uint8_t *)0x0) {
    WebPInitDecBuffer(&local_a8);
    local_118.emit = (OutputFunc)0x0;
    local_118.emit_alpha = (OutputAlphaFunc)0x0;
    local_118.scaler_a = (WebPRescaler *)0x0;
    local_118.memory = (void *)0x0;
    local_118.scaler_u = (WebPRescaler *)0x0;
    local_118.scaler_v = (WebPRescaler *)0x0;
    local_118.options = (WebPDecoderOptions *)0x0;
    local_118.scaler_y = (WebPRescaler *)0x0;
    local_118.emit_alpha_row = (OutputRowFunc)0x0;
    local_118.tmp_v = (uint8_t *)0x0;
    local_118.last_y = 0;
    local_118._36_4_ = 0;
    local_118.tmp_y = (uint8_t *)0x0;
    local_118.tmp_u = (uint8_t *)0x0;
    local_a8.is_external_memory = 1;
    local_118.output = &local_a8;
    local_a8.colorspace = colorspace;
    local_a8.u.RGBA.rgba = rgba;
    local_a8.u.RGBA.stride = stride;
    local_a8.u.RGBA.size = size;
    VVar1 = DecodeInto(data,data_size,&local_118);
    puVar2 = (uint8_t *)0x0;
    if (VVar1 == VP8_STATUS_OK) {
      puVar2 = rgba;
    }
    return puVar2;
  }
  return (uint8_t *)0x0;
}

Assistant:

static uint8_t* DecodeIntoRGBABuffer(WEBP_CSP_MODE colorspace,
                                     const uint8_t* const data,
                                     size_t data_size,
                                     uint8_t* const rgba,
                                     int stride, size_t size) {
  WebPDecParams params;
  WebPDecBuffer buf;
  if (rgba == NULL) {
    return NULL;
  }
  WebPInitDecBuffer(&buf);
  WebPResetDecParams(&params);
  params.output = &buf;
  buf.colorspace    = colorspace;
  buf.u.RGBA.rgba   = rgba;
  buf.u.RGBA.stride = stride;
  buf.u.RGBA.size   = size;
  buf.is_external_memory = 1;
  if (DecodeInto(data, data_size, &params) != VP8_STATUS_OK) {
    return NULL;
  }
  return rgba;
}